

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall
spdlog::
create<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>,std::__cxx11::string,unsigned_long,unsigned_long>
          (spdlog *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  registry_t<std::mutex> *logger_name_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar2;
  sinks_init_list sinks;
  element_type *local_c0;
  element_type local_80;
  element_type local_70 [2];
  undefined1 local_50 [24];
  sink_ptr sink;
  unsigned_long args_local_2;
  unsigned_long args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *logger_name_local;
  
  sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args_2;
  args_local_2 = args_1;
  args_local_1 = (unsigned_long)args;
  args_local = logger_name;
  logger_name_local = (string *)this;
  std::
  make_shared<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>,std::__cxx11::string&,unsigned_long&,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (unsigned_long *)args,&args_local_2);
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>,void>
            ((shared_ptr<spdlog::sinks::sink> *)(local_50 + 0x10),
             (shared_ptr<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>_> *)local_50
            );
  std::shared_ptr<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>_> *)local_50
            );
  logger_name_00 = details::registry_t<std::mutex>::instance();
  pbVar1 = args_local;
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)&local_80,
             (shared_ptr<spdlog::sinks::sink> *)(local_50 + 0x10));
  local_70[0]._level.super___atomic_base<int>._M_i = (__atomic_base<int>)0x1;
  local_70[0]._12_4_ = 0;
  sinks._M_len = (size_type)&local_80;
  sinks._M_array = (iterator)pbVar1;
  local_70[0]._vptr_sink = (_func_int **)&local_80;
  details::registry_t<std::mutex>::create
            ((registry_t<std::mutex> *)this,(string *)logger_name_00,sinks);
  local_c0 = local_70;
  do {
    local_c0 = local_c0 + -1;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)local_c0);
  } while (local_c0 != &local_80);
  std::shared_ptr<spdlog::sinks::sink>::~shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)(local_50 + 0x10));
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}